

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::getFirstLeakForAllocationStage
          (MemoryLeakDetectorTable *this,uchar allocation_stage)

{
  MemoryLeakDetectorNode *cur;
  MemoryLeakDetectorNode *pMVar1;
  int i;
  long lVar2;
  
  lVar2 = 0;
  do {
    for (pMVar1 = this->table_[lVar2].head_; pMVar1 != (MemoryLeakDetectorNode *)0x0;
        pMVar1 = *(MemoryLeakDetectorNode **)(pMVar1 + 0x38)) {
      if (pMVar1[0x34] == (MemoryLeakDetectorNode)allocation_stage) {
        return pMVar1;
      }
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x49);
  return (MemoryLeakDetectorNode *)0x0;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::getFirstLeakForAllocationStage(unsigned char allocation_stage)
{
    for (int i = 0; i < hash_prime; i++) {
        MemoryLeakDetectorNode* node = table_[i].getFirstLeakForAllocationStage(allocation_stage);
        if (node) return node;
    }
    return NULLPTR;
}